

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

uint PrintStackFrame(int address,char *current,uint bufSize,bool withVariables)

{
  char cVar1;
  int iVar2;
  ExternVarInfo *pEVar3;
  ExternVarInfo *pEVar4;
  char *pcVar5;
  bool bVar6;
  undefined8 in_stack_fffffffffffffe90;
  char *local_158;
  char *local_150;
  char *localType_1;
  char *localName_1;
  char *typeName_1;
  ExternVarInfo *vInfo;
  uint i_3;
  ExternVarInfo *exVariables;
  char *pcStack_108;
  uint exVariablesSize;
  char *offsetType;
  char *localType;
  char *localName;
  char *typeName;
  ExternLocalInfo *lInfo;
  ExternLocalInfo *pEStack_d8;
  uint i_2;
  ExternLocalInfo *exLocals;
  ExternTypeInfo *pEStack_c8;
  uint exLocalsSize;
  ExternTypeInfo *exTypes;
  uint local_b8;
  uint exTypesSize;
  int codeLength;
  uint line;
  char *moduleStart;
  char *pcStack_a0;
  uint l;
  char *prevEnd;
  char *pcStack_90;
  uint moduleID;
  char *codeEnd;
  char *codeStart;
  uint i_1;
  uint infoID;
  uint i;
  int funcID;
  char *source;
  ExternSourceInfo *exInfo;
  ExternModuleInfo *pEStack_58;
  uint exInfoSize;
  ExternModuleInfo *exModules;
  char *pcStack_48;
  uint exModulesSize;
  char *exSymbols;
  ExternFuncInfo *exFunctions;
  char *pcStack_30;
  uint exFunctionsSize;
  char *start;
  bool withVariables_local;
  char *pcStack_20;
  uint bufSize_local;
  char *current_local;
  int address_local;
  
  exFunctions._4_4_ = 0;
  pcStack_30 = current;
  start._3_1_ = withVariables;
  start._4_4_ = bufSize;
  pcStack_20 = current;
  current_local._4_4_ = address;
  exSymbols = (char *)nullcDebugFunctionInfo((uint *)((long)&exFunctions + 4));
  pcStack_48 = nullcDebugSymbols((uint *)0x0);
  exModules._4_4_ = 0;
  pEStack_58 = nullcDebugModuleInfo((uint *)((long)&exModules + 4));
  exInfo._4_4_ = 0;
  source = (char *)nullcDebugSourceInfo((uint *)((long)&exInfo + 4));
  _i = nullcDebugSource();
  infoID = 0xffffffff;
  for (i_1 = 0; i_1 < exFunctions._4_4_; i_1 = i_1 + 1) {
    if ((*(int *)(exSymbols + (ulong)i_1 * 0x94 + 4) <= current_local._4_4_) &&
       (current_local._4_4_ <
        *(int *)(exSymbols + (ulong)i_1 * 0x94 + 4) + *(int *)(exSymbols + (ulong)i_1 * 0x94 + 8)))
    {
      infoID = i_1;
    }
  }
  if (infoID == 0xffffffff) {
    pcVar5 = "global scope";
    if (current_local._4_4_ == -1) {
      pcVar5 = "external";
    }
    iVar2 = NULLC::SafeSprintf(pcStack_20,(ulong)(start._4_4_ - ((int)pcStack_20 - (int)pcStack_30))
                               ,"%s",pcVar5);
    pcStack_20 = pcStack_20 + iVar2;
  }
  else {
    iVar2 = NULLC::SafeSprintf(pcStack_20,(ulong)(start._4_4_ - ((int)pcStack_20 - (int)pcStack_30))
                               ,"%s",pcStack_48 + *(uint *)(exSymbols + (long)(int)infoID * 0x94));
    pcStack_20 = pcStack_20 + iVar2;
  }
  if (current_local._4_4_ != -1) {
    codeStart._4_4_ = 0;
    codeStart._0_4_ = current_local._4_4_ - 1;
    while( true ) {
      bVar6 = false;
      if (codeStart._4_4_ < exInfo._4_4_ - 1U) {
        bVar6 = *(uint *)(source + (ulong)(codeStart._4_4_ + 1) * 0xc) <= (uint)codeStart;
      }
      if (!bVar6) break;
      codeStart._4_4_ = codeStart._4_4_ + 1;
    }
    codeEnd = _i + *(uint *)(source + (ulong)codeStart._4_4_ * 0xc + 8);
    while( true ) {
      bVar6 = false;
      if (codeEnd != _i) {
        bVar6 = codeEnd[-1] != '\n';
      }
      if (!bVar6) break;
      codeEnd = codeEnd + -1;
    }
    while( true ) {
      bVar6 = true;
      if (*codeEnd != ' ') {
        bVar6 = *codeEnd == '\t';
      }
      if (!bVar6) break;
      codeEnd = codeEnd + 1;
    }
    pcStack_90 = codeEnd;
    prevEnd._4_4_ = 0xffffffff;
    pcStack_a0 = (char *)0x0;
    moduleStart._4_4_ = 0;
    while ((moduleStart._4_4_ < exModules._4_4_ &&
           (((_i + pEStack_58[moduleStart._4_4_].sourceOffset <= pcStack_a0 ||
             (codeEnd < pcStack_a0)) || (_i + pEStack_58[moduleStart._4_4_].sourceOffset <= codeEnd)
            )))) {
      if ((_i + pEStack_58[moduleStart._4_4_].sourceOffset <= codeEnd) &&
         (codeEnd < _i + (ulong)pEStack_58[moduleStart._4_4_].sourceSize +
                         (ulong)pEStack_58[moduleStart._4_4_].sourceOffset)) {
        prevEnd._4_4_ = moduleStart._4_4_;
      }
      pcStack_a0 = _i + (ulong)pEStack_58[moduleStart._4_4_].sourceSize +
                        (ulong)pEStack_58[moduleStart._4_4_].sourceOffset;
      moduleStart._4_4_ = moduleStart._4_4_ + 1;
    }
    if (prevEnd._4_4_ == 0xffffffff) {
      _codeLength = pcStack_a0;
    }
    else {
      _codeLength = _i + pEStack_58[prevEnd._4_4_].sourceOffset;
    }
    exTypesSize = 0;
    while (_codeLength < codeEnd) {
      pcVar5 = _codeLength + 1;
      cVar1 = *_codeLength;
      _codeLength = pcVar5;
      if (cVar1 == '\n') {
        exTypesSize = exTypesSize + 1;
      }
    }
    while( true ) {
      bVar6 = false;
      if ((*pcStack_90 != '\0') && (bVar6 = false, *pcStack_90 != '\r')) {
        bVar6 = *pcStack_90 != '\n';
      }
      if (!bVar6) break;
      pcStack_90 = pcStack_90 + 1;
    }
    local_b8 = (int)pcStack_90 - (int)codeEnd;
    iVar2 = NULLC::SafeSprintf(pcStack_20,(ulong)(start._4_4_ - ((int)pcStack_20 - (int)pcStack_30))
                               ," (line %d: at %.*s)\r\n",(ulong)(exTypesSize + 1),(ulong)local_b8,
                               codeEnd);
    pcStack_20 = pcStack_20 + iVar2;
  }
  if ((start._3_1_ & 1) != 0) {
    exTypes._4_4_ = 0;
    pEStack_c8 = nullcDebugTypeInfo((uint *)((long)&exTypes + 4));
    if (infoID == 0xffffffff) {
      exVariables._4_4_ = 0;
      pEVar3 = nullcDebugVariableInfo((uint *)((long)&exVariables + 4));
      for (vInfo._4_4_ = 0; vInfo._4_4_ < exVariables._4_4_; vInfo._4_4_ = vInfo._4_4_ + 1) {
        pEVar4 = pEVar3 + vInfo._4_4_;
        in_stack_fffffffffffffe90 =
             CONCAT44((int)((ulong)in_stack_fffffffffffffe90 >> 0x20),pEVar4->offset);
        iVar2 = NULLC::SafeSprintf(pcStack_20,
                                   (ulong)(start._4_4_ - ((int)pcStack_20 - (int)pcStack_30)),
                                   " %s %d: %s %s (at %d size %d)\r\n","global",(ulong)vInfo._4_4_,
                                   pcStack_48 + pEStack_c8[pEVar4->type].offsetToName,
                                   pcStack_48 + pEVar4->offsetToName,in_stack_fffffffffffffe90,
                                   pEStack_c8[pEVar4->type].size);
        pcStack_20 = pcStack_20 + iVar2;
      }
    }
    else {
      exLocals._4_4_ = 0;
      pEStack_d8 = nullcDebugLocalInfo((uint *)((long)&exLocals + 4));
      for (lInfo._4_4_ = 0;
          lInfo._4_4_ <
          (uint)(*(int *)(exSymbols + (long)(int)infoID * 0x94 + 0x58) +
                *(int *)(exSymbols + (long)(int)infoID * 0x94 + 0x5c));
          lInfo._4_4_ = lInfo._4_4_ + 1) {
        typeName = (char *)(pEStack_d8 +
                           (*(int *)(exSymbols + (long)(int)infoID * 0x94 + 0x50) + lInfo._4_4_));
        localName = pcStack_48 + pEStack_c8[((ExternLocalInfo *)typeName)->type].offsetToName;
        localType = pcStack_48 + ((ExternLocalInfo *)typeName)->offsetToName;
        if (((ExternLocalInfo *)typeName)->paramType == '\0') {
          local_150 = "param";
        }
        else {
          local_150 = "local";
          if (((ExternLocalInfo *)typeName)->paramType == '\x02') {
            local_150 = "extern";
          }
        }
        offsetType = local_150;
        if ((((ExternLocalInfo *)typeName)->paramType == '\0') ||
           (((ExternLocalInfo *)typeName)->paramType == '\x01')) {
          local_158 = "base";
        }
        else {
          local_158 = "closure";
          if ((((ExternLocalInfo *)typeName)->closeListID & 0x80000000) != 0) {
            local_158 = "local";
          }
        }
        pcStack_108 = local_158;
        iVar2 = NULLC::SafeSprintf(pcStack_20,
                                   (ulong)(start._4_4_ - ((int)pcStack_20 - (int)pcStack_30)),
                                   " %s %d: %s %s (at %s+%d size %d)\r\n",local_150,
                                   (ulong)lInfo._4_4_,localName,localType,local_158,
                                   ((ExternLocalInfo *)typeName)->offset,
                                   pEStack_c8[((ExternLocalInfo *)typeName)->type].size);
        pcStack_20 = pcStack_20 + iVar2;
      }
    }
  }
  return (int)pcStack_20 - (int)pcStack_30;
}

Assistant:

unsigned int PrintStackFrame(int address, char* current, unsigned int bufSize, bool withVariables)
{
	const char *start = current;

	unsigned exFunctionsSize = 0;
	ExternFuncInfo *exFunctions = nullcDebugFunctionInfo(&exFunctionsSize);

	char *exSymbols = nullcDebugSymbols(NULL);

	unsigned exModulesSize = 0;
	ExternModuleInfo *exModules = nullcDebugModuleInfo(&exModulesSize);

	unsigned exInfoSize = 0;
	ExternSourceInfo *exInfo = nullcDebugSourceInfo(&exInfoSize);

	char *source = nullcDebugSource();

	int funcID = -1;
	for(unsigned int i = 0; i < exFunctionsSize; i++)
	{
		if(address >= exFunctions[i].regVmAddress && address < (exFunctions[i].regVmAddress + exFunctions[i].regVmCodeSize))
			funcID = i;
	}

	if(funcID != -1)
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", &exSymbols[exFunctions[funcID].offsetToName]);
	else
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), "%s", address == -1 ? "external" : "global scope");

	if(address != -1)
	{
		unsigned int infoID = 0;
		unsigned int i = address - 1;
		while((infoID < exInfoSize - 1) && (i >= exInfo[infoID + 1].instruction))
			infoID++;
		const char *codeStart = source + exInfo[infoID].sourceOffset;

		// Find beginning of the line
		while(codeStart != source && *(codeStart-1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;
		const char *codeEnd = codeStart;

		// Find corresponding module
		unsigned moduleID = ~0u;
		const char *prevEnd = NULL;
		for(unsigned l = 0; l < exModulesSize; l++)
		{
			// special check for main module
			if(source + exModules[l].sourceOffset > prevEnd && codeStart >= prevEnd && codeStart < source + exModules[l].sourceOffset)
				break;
			if(codeStart >= source + exModules[l].sourceOffset && codeStart < source + exModules[l].sourceOffset + exModules[l].sourceSize)
				moduleID = l;
			prevEnd = source + exModules[l].sourceOffset + exModules[l].sourceSize;
		}
		const char *moduleStart = NULL;
		if(moduleID != ~0u)
			moduleStart = source + exModules[moduleID].sourceOffset;
		else
			moduleStart = prevEnd;

		// Find line number
		unsigned line = 0;
		while(moduleStart < codeStart)
		{
			if(*moduleStart++ == '\n')
				line++;
		}

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = (int)(codeEnd - codeStart);
		current += NULLC::SafeSprintf(current, bufSize - int(current - start), " (line %d: at %.*s)\r\n", line + 1, codeLength, codeStart);
	}

	if(withVariables)
	{
		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		if(funcID != -1)
		{
			unsigned exLocalsSize = 0;
			ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

			for(unsigned int i = 0; i < exFunctions[funcID].localCount + exFunctions[funcID].externCount; i++)
			{
				ExternLocalInfo &lInfo = exLocals[exFunctions[funcID].offsetToFirstLocal + i];
				const char *typeName = &exSymbols[exTypes[lInfo.type].offsetToName];
				const char *localName = &exSymbols[lInfo.offsetToName];
				const char *localType = lInfo.paramType == ExternLocalInfo::PARAMETER ? "param" : (lInfo.paramType == ExternLocalInfo::EXTERNAL ? "extern" : "local");
				const char *offsetType = (lInfo.paramType == ExternLocalInfo::PARAMETER || lInfo.paramType == ExternLocalInfo::LOCAL) ? "base" : (lInfo.closeListID & 0x80000000 ? "local" : "closure");
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %s+%d size %d)\r\n",	localType, i, typeName, localName, offsetType, lInfo.offset, exTypes[lInfo.type].size);
			}
		}
		else
		{
			unsigned exVariablesSize = 0;
			ExternVarInfo *exVariables = nullcDebugVariableInfo(&exVariablesSize);

			for(unsigned i = 0; i < exVariablesSize; i++)
			{
				ExternVarInfo &vInfo = exVariables[i];

				const char *typeName = &exSymbols[exTypes[vInfo.type].offsetToName];
				const char *localName = &exSymbols[vInfo.offsetToName];
				const char *localType = "global";
				current += NULLC::SafeSprintf(current, bufSize - int(current - start), " %s %d: %s %s (at %d size %d)\r\n", localType, i, typeName, localName, vInfo.offset, exTypes[vInfo.type].size);
			}
		}
	}

	return (unsigned int)(current - start);
}